

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  stbi__uint32 a;
  stbi__uint32 b;
  uint uVar1;
  uint uVar2;
  stbi__context *s;
  stbi_uc sVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  stbi_uc sVar6;
  byte bVar7;
  int iVar8;
  void *pvVar9;
  ulong uVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  stbi_uc **ppsVar11;
  long lVar12;
  int iVar13;
  int *piVar14;
  uint uVar15;
  uint uVar16;
  long local_40;
  
  s = z->s;
  sVar3 = stbi__get8(s);
  sVar4 = stbi__get8(s);
  if (10 < CONCAT11(sVar3,sVar4)) {
    sVar5 = stbi__get8(s);
    if (sVar5 != '\b') {
      stbi__g_failure_reason = "only 8-bit";
      return 0;
    }
    sVar5 = stbi__get8(s);
    sVar6 = stbi__get8(s);
    s->img_y = (uint)CONCAT11(sVar5,sVar6);
    if (CONCAT11(sVar5,sVar6) == 0) {
      stbi__g_failure_reason = "no header height";
      return 0;
    }
    sVar5 = stbi__get8(s);
    sVar6 = stbi__get8(s);
    s->img_x = (uint)CONCAT11(sVar5,sVar6);
    if (CONCAT11(sVar5,sVar6) == 0) {
      stbi__g_failure_reason = "0 width";
      return 0;
    }
    bVar7 = stbi__get8(s);
    if ((4 < bVar7) || ((0x1aU >> (bVar7 & 0x1f) & 1) == 0)) {
      stbi__g_failure_reason = "bad component count";
      return 0;
    }
    s->img_n = (uint)bVar7;
    uVar10 = (ulong)bVar7;
    ppsVar11 = &z->img_comp[0].data;
    do {
      *ppsVar11 = (stbi_uc *)0x0;
      ppsVar11[3] = (stbi_uc *)0x0;
      ppsVar11 = ppsVar11 + 0xc;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
    if (CONCAT11(sVar3,sVar4) == (ushort)((ushort)bVar7 + (ushort)bVar7 * 2 + 8)) {
      z->rgb = 0;
      piVar14 = &z->img_comp[0].tq;
      lVar12 = 0;
      do {
        bVar7 = stbi__get8(s);
        ((anon_struct_96_18_0d0905d3 *)(piVar14 + -3))->id = (uint)bVar7;
        if ((s->img_n == 3) && (bVar7 == "RGB"[lVar12])) {
          z->rgb = z->rgb + 1;
        }
        bVar7 = stbi__get8(s);
        piVar14[-2] = (uint)(bVar7 >> 4);
        if ((byte)(bVar7 + 0xb0) < 0xc0) {
          stbi__g_failure_reason = "bad H";
          return 0;
        }
        piVar14[-1] = bVar7 & 0xf;
        if ((bVar7 & 0xf) - 5 < 0xfffffffc) {
          stbi__g_failure_reason = "bad V";
          return 0;
        }
        bVar7 = stbi__get8(s);
        *piVar14 = (uint)bVar7;
        if (3 < bVar7) {
          stbi__g_failure_reason = "bad TQ";
          return 0;
        }
        lVar12 = lVar12 + 1;
        iVar13 = s->img_n;
        piVar14 = piVar14 + 0x18;
      } while (lVar12 < iVar13);
      if (scan != 0) {
        return 1;
      }
      a = s->img_x;
      b = s->img_y;
      iVar8 = stbi__mad3sizes_valid(a,b,iVar13,0);
      if (iVar8 == 0) {
        stbi__g_failure_reason = "too large";
        return 0;
      }
      uVar16 = 1;
      uVar15 = 1;
      if (0 < iVar13) {
        uVar15 = 1;
        lVar12 = 0;
        uVar16 = 1;
        do {
          uVar1 = *(uint *)((long)&z->img_comp[0].h + lVar12);
          uVar2 = *(uint *)((long)&z->img_comp[0].v + lVar12);
          if ((int)uVar16 < (int)uVar1) {
            uVar16 = uVar1;
          }
          if ((int)uVar15 < (int)uVar2) {
            uVar15 = uVar2;
          }
          lVar12 = lVar12 + 0x60;
        } while ((long)iVar13 * 0x60 != lVar12);
      }
      z->img_h_max = uVar16;
      z->img_v_max = uVar15;
      z->img_mcu_w = uVar16 * 8;
      z->img_mcu_h = uVar15 * 8;
      z->img_mcu_x = ((a + uVar16 * 8) - 1) / (uVar16 * 8);
      z->img_mcu_y = ((b + uVar15 * 8) - 1) / (uVar15 * 8);
      if (iVar13 < 1) {
        return 1;
      }
      piVar14 = &z->img_comp[0].coeff_w;
      local_40 = 0;
      while( true ) {
        piVar14[-0xf] = (s->img_x * piVar14[-0x15] + (uVar16 - 1)) / uVar16;
        piVar14[-0xe] = (s->img_y * piVar14[-0x14] + (uVar15 - 1)) / uVar15;
        iVar8 = piVar14[-0x15] * z->img_mcu_x * 8;
        piVar14[-0xd] = iVar8;
        iVar13 = piVar14[-0x14] * z->img_mcu_y * 8;
        piVar14[-0xc] = iVar13;
        *(undefined1 (*) [16])(piVar14 + -6) = (undefined1  [16])0x0;
        *(short **)(piVar14 + -2) = (short *)0x0;
        pvVar9 = stbi__malloc_mad2(iVar8,iVar13,0xf);
        *(void **)(piVar14 + -8) = pvVar9;
        iVar13 = extraout_EDX;
        if (pvVar9 == (void *)0x0) break;
        *(stbi_uc **)(piVar14 + -10) = (stbi_uc *)((long)pvVar9 + 0xfU & 0xfffffffffffffff0);
        if (z->progressive != 0) {
          iVar8 = (int)*(undefined8 *)(piVar14 + -0xd);
          iVar13 = (int)((ulong)*(undefined8 *)(piVar14 + -0xd) >> 0x20);
          *(ulong *)piVar14 =
               CONCAT44((int)(((uint)(iVar13 >> 0x1f) >> 0x1d) + iVar13) >> 3,
                        (int)(((uint)(iVar8 >> 0x1f) >> 0x1d) + iVar8) >> 3);
          pvVar9 = stbi__malloc_mad3(iVar8,iVar13,2,0xf);
          *(void **)(piVar14 + -6) = pvVar9;
          iVar13 = extraout_EDX_00;
          if (pvVar9 == (void *)0x0) break;
          *(short **)(piVar14 + -2) = (short *)((long)pvVar9 + 0xfU & 0xfffffffffffffff0);
        }
        local_40 = local_40 + 1;
        piVar14 = piVar14 + 0x18;
        if (s->img_n <= local_40) {
          return 1;
        }
      }
      stbi__g_failure_reason = "outofmem";
      stbi__free_jpeg_components(z,(int)local_40 + 1,iVar13);
      return 0;
    }
  }
  stbi__g_failure_reason = "bad SOF len";
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}